

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O3

void __thiscall uWS::TopicTree::trimTree(TopicTree *this,Topic *topic)

{
  int iVar1;
  Topic *topic_00;
  long lVar2;
  uint uVar3;
  long lVar4;
  Topic *tmp [64];
  key_type local_228 [32];
  
  if ((topic->subs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    return;
  }
  if ((topic->children)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    return;
  }
  if (topic->terminatingWildcardChild != (Topic *)0x0) {
    return;
  }
  if (topic->wildcardChild != (Topic *)0x0) {
    return;
  }
  topic_00 = topic->parent;
  local_228[0]._M_str = topic->name;
  local_228[0]._M_len = topic->length;
  if (local_228[0]._M_len == 1) {
    if (*local_228[0]._M_str == '#') {
      lVar2 = 0x58;
    }
    else {
      if (*local_228[0]._M_str != '+') goto LAB_00142473;
      lVar2 = 0x50;
    }
    *(undefined8 *)((long)&topic_00->name + lVar2) = 0;
  }
LAB_00142473:
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>_>_>
  ::erase(&topic_00->children,local_228);
  if (topic->triggered == true) {
    iVar1 = this->numTriggeredTopics;
    if ((long)iVar1 < 1) {
      uVar3 = 0;
    }
    else {
      lVar2 = 0;
      uVar3 = 0;
      do {
        if (this->triggeredTopics[lVar2] != topic) {
          lVar4 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          (&local_228[0]._M_len)[lVar4] = (size_t)this->triggeredTopics[lVar2];
        }
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
      if (0 < (int)uVar3) {
        memcpy(this->triggeredTopics,local_228,(ulong)uVar3 << 3);
      }
    }
    this->numTriggeredTopics = uVar3;
  }
  if (topic->name != (char *)0x0) {
    operator_delete__(topic->name);
  }
  Topic::~Topic(topic);
  operator_delete(topic,0xc0);
  if (topic_00 != this->root) {
    trimTree(this,topic_00);
  }
  return;
}

Assistant:

void trimTree(Topic *topic) {
        if (!topic->subs.size() && !topic->children.size() && !topic->terminatingWildcardChild && !topic->wildcardChild) {
            Topic *parent = topic->parent;

            if (topic->length == 1) {
                if (topic->name[0] == '#') {
                    parent->terminatingWildcardChild = nullptr;
                } else if (topic->name[0] == '+') {
                    parent->wildcardChild = nullptr;
                }
            }
            /* Erase us from our parents set (wildcards also live here) */
            parent->children.erase(std::string_view(topic->name, topic->length));

            /* If this node is triggered, make sure to remove it from the triggered list */
            if (topic->triggered) {
                Topic *tmp[64];
                int length = 0;
                for (int i = 0; i < numTriggeredTopics; i++) {
                    if (triggeredTopics[i] != topic) {
                        tmp[length++] = triggeredTopics[i];
                    }
                }

                for (int i = 0; i < length; i++) {
                    triggeredTopics[i] = tmp[i];
                }
                numTriggeredTopics = length;
            }

            /* Free various memory for the node */
            delete [] topic->name;
            delete topic;

            if (parent != root) {
                trimTree(parent);
            }
        }
    }